

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<WorkSpace> * __thiscall
pybind11::class_<WorkSpace>::
def<LinkedReadsDatastore&(WorkSpace::*)(std::__cxx11::string_const&),pybind11::arg,pybind11::return_value_policy>
          (class_<WorkSpace> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          return_value_policy *extra_1)

{
  none *this_00;
  undefined8 *in_RDX;
  is_method *extra_1_00;
  handle in_RSI;
  handle *in_RDI;
  object *unaff_retaddr;
  cpp_function cf;
  handle *in_stack_ffffffffffffff38;
  sibling *in_stack_ffffffffffffff40;
  handle in_stack_ffffffffffffff68;
  name *in_stack_ffffffffffffff78;
  offset_in_Node_to_subr in_stack_ffffffffffffff80;
  cpp_function *local_78;
  is_method in_stack_ffffffffffffffb0;
  name in_stack_ffffffffffffffb8;
  PyObject *cf_00;
  handle *name__00;
  
  name__00 = in_RDI;
  this_00 = (none *)_WorkSpace___pybind11__method_adaptor<WorkSpace,LinkedReadsDatastore&,WorkSpace,std::__cxx11::string_const&>_LinkedReadsDatastore__WorkSpace_____std____cxx11__string_const____
                              ((void *)*in_RDX,in_RDX[1]);
  pybind11::name::name((name *)&stack0xffffffffffffffb8,(char *)in_RSI.m_ptr);
  is_method::is_method((is_method *)&stack0xffffffffffffffb0,in_RDI);
  cf_00 = in_RSI.m_ptr;
  none::none(this_00);
  getattr(in_stack_ffffffffffffff68,(char *)in_RDI,in_RSI);
  sibling::sibling(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  cpp_function::
  cpp_function<LinkedReadsDatastore&,WorkSpace,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::return_value_policy>
            (local_78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,extra_1_00,
             (sibling *)this_00,(arg *)in_stack_ffffffffffffffb0.class_.m_ptr,
             (return_value_policy *)in_stack_ffffffffffffffb8.value);
  object::~object((object *)0x280b3b);
  none::~none((none *)0x280b45);
  pybind11::detail::add_class_method(unaff_retaddr,(char *)name__00,(cpp_function *)cf_00);
  cpp_function::~cpp_function((cpp_function *)0x280b6e);
  return (class_<WorkSpace> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }